

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnexpectedCommand.h
# Opt level: O0

void __thiscall
cmUnexpectedCommand::cmUnexpectedCommand(cmUnexpectedCommand *this,string *name,char *error)

{
  char *error_local;
  string *name_local;
  cmUnexpectedCommand *this_local;
  
  cmCommand::cmCommand(&this->super_cmCommand);
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmUnexpectedCommand_009b3f88;
  std::__cxx11::string::string((string *)&this->Name,(string *)name);
  this->Error = error;
  return;
}

Assistant:

cmUnexpectedCommand(std::string name, const char* error)
    : Name(std::move(name))
    , Error(error)
  {
  }